

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int mg_inet_pton(int af,char *src,void *dst,size_t dstlen,int resolve_src)

{
  addrinfo *__ai;
  int iVar1;
  int local_74;
  int gai_ret;
  int func_ret;
  addrinfo *ressave;
  addrinfo *res;
  addrinfo hints;
  int resolve_src_local;
  size_t dstlen_local;
  void *dst_local;
  char *src_local;
  int af_local;
  
  local_74 = 0;
  hints.ai_next._4_4_ = resolve_src;
  memset(&res,0,0x30);
  if (hints.ai_next._4_4_ == 0) {
    res._0_4_ = 4;
  }
  res._4_4_ = af;
  iVar1 = getaddrinfo(src,(char *)0x0,(addrinfo *)&res,(addrinfo **)&ressave);
  __ai = ressave;
  if (iVar1 == 0) {
    for (; ressave != (addrinfo *)0x0; ressave = ressave->ai_next) {
      if ((ressave->ai_addrlen <= dstlen) && ((uint)ressave->ai_addr->sa_family == af)) {
        memcpy(dst,ressave->ai_addr,(ulong)ressave->ai_addrlen);
        local_74 = 1;
      }
    }
    freeaddrinfo((addrinfo *)__ai);
    src_local._4_4_ = local_74;
  }
  else {
    src_local._4_4_ = 0;
  }
  return src_local._4_4_;
}

Assistant:

static int
mg_inet_pton(int af, const char *src, void *dst, size_t dstlen, int resolve_src)
{
	struct addrinfo hints, *res, *ressave;
	int func_ret = 0;
	int gai_ret;

	memset(&hints, 0, sizeof(struct addrinfo));
	hints.ai_family = af;
	if (!resolve_src) {
		hints.ai_flags = AI_NUMERICHOST;
	}

	gai_ret = getaddrinfo(src, NULL, &hints, &res);
	if (gai_ret != 0) {
		/* gai_strerror could be used to convert gai_ret to a string */
		/* POSIX return values: see
		 * http://pubs.opengroup.org/onlinepubs/9699919799/functions/freeaddrinfo.html
		 */
		/* Windows return values: see
		 * https://msdn.microsoft.com/en-us/library/windows/desktop/ms738520%28v=vs.85%29.aspx
		 */
		return 0;
	}

	ressave = res;

	while (res) {
		if ((dstlen >= (size_t)res->ai_addrlen)
		    && (res->ai_addr->sa_family == af)) {
			memcpy(dst, res->ai_addr, res->ai_addrlen);
			func_ret = 1;
		}
		res = res->ai_next;
	}

	freeaddrinfo(ressave);
	return func_ret;
}